

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlanningUnitMADPDiscrete.cpp
# Opt level: O2

JointActionObservationHistoryTree * __thiscall
PlanningUnitMADPDiscrete::GetJointActionObservationHistoryTree
          (PlanningUnitMADPDiscrete *this,LIndex jaohI)

{
  Index IVar1;
  _Base_ptr *pp_Var2;
  const_iterator cVar3;
  LIndex local_10;
  
  local_10 = jaohI;
  if ((this->_m_params)._m_jointActionObservationHistories == true) {
    IVar1 = Globals::CastLIndexToIndex(jaohI);
    pp_Var2 = (_Base_ptr *)
              std::
              vector<JointActionObservationHistoryTree_*,_std::allocator<JointActionObservationHistoryTree_*>_>
              ::at(&this->_m_jointActionObservationHistoryTreeVector,(ulong)IVar1);
  }
  else {
    cVar3 = std::
            _Rb_tree<unsigned_long_long,_std::pair<const_unsigned_long_long,_JointActionObservationHistoryTree_*>,_std::_Select1st<std::pair<const_unsigned_long_long,_JointActionObservationHistoryTree_*>_>,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_JointActionObservationHistoryTree_*>_>_>
            ::find(&(this->_m_jointActionObservationHistoryTreeMap)._M_t,&local_10);
    if ((_Rb_tree_header *)cVar3._M_node ==
        &(this->_m_jointActionObservationHistoryTreeMap)._M_t._M_impl.super__Rb_tree_header) {
      return (JointActionObservationHistoryTree *)0x0;
    }
    pp_Var2 = &cVar3._M_node[1]._M_parent;
  }
  return (value_type)*pp_Var2;
}

Assistant:

JointActionObservationHistoryTree* 
PlanningUnitMADPDiscrete::GetJointActionObservationHistoryTree(LIndex jaohI)
    const
{
    if(_m_params.GetComputeJointActionObservationHistories())
        return(_m_jointActionObservationHistoryTreeVector.at(CastLIndexToIndex(jaohI)));
    else
    {
        // cannot use m_jointActionObservationHistoryTreeMap[jaohI],
        // it violates the const, as it creates an empty object if
        // jaohI does not exist yet
        map<LIndex,JointActionObservationHistoryTree*>::const_iterator cit
            = _m_jointActionObservationHistoryTreeMap.find(jaohI);
        if(cit!=_m_jointActionObservationHistoryTreeMap.end())
            return(cit->second);
        else
        {
            return(0);
//            throw(E("GetJointActionObservationHistoryTree:: index not found in map"));
        }
    }
}